

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O0

void ycc_rgb_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                    JSAMPARRAY output_buf,int num_rows)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  jpeg_color_deconverter *pjVar4;
  JSAMPLE *pJVar5;
  _func_void_j_decompress_ptr *p_Var6;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *p_Var7;
  _func_void_j_decompress_ptr *p_Var8;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *p_Var9;
  JSAMPROW pJVar10;
  JSAMPROW pJVar11;
  JSAMPROW pJVar12;
  uint uVar13;
  JSAMPARRAY ppJVar14;
  INT32 *Cbgtab;
  INT32 *Crgtab;
  int *Cbbtab;
  int *Crrtab;
  JSAMPLE *range_limit;
  JDIMENSION num_cols;
  JDIMENSION col;
  JSAMPROW inptr2;
  JSAMPROW inptr1;
  JSAMPROW inptr0;
  JSAMPROW outptr;
  int cr;
  int cb;
  int y;
  my_cconvert_ptr cconvert;
  JSAMPARRAY ppJStack_28;
  int num_rows_local;
  JSAMPARRAY output_buf_local;
  JDIMENSION input_row_local;
  JSAMPIMAGE input_buf_local;
  j_decompress_ptr cinfo_local;
  
  pjVar4 = cinfo->cconvert;
  uVar3 = cinfo->output_width;
  pJVar5 = cinfo->sample_range_limit;
  p_Var6 = pjVar4[1].start_pass;
  p_Var7 = pjVar4[1].color_convert;
  p_Var8 = pjVar4[2].start_pass;
  p_Var9 = pjVar4[2].color_convert;
  cconvert._4_4_ = num_rows;
  ppJStack_28 = output_buf;
  output_buf_local._4_4_ = input_row;
  while (cconvert._4_4_ = cconvert._4_4_ + -1, -1 < cconvert._4_4_) {
    pJVar10 = (*input_buf)[output_buf_local._4_4_];
    pJVar11 = input_buf[1][output_buf_local._4_4_];
    pJVar12 = input_buf[2][output_buf_local._4_4_];
    output_buf_local._4_4_ = output_buf_local._4_4_ + 1;
    ppJVar14 = ppJStack_28 + 1;
    inptr0 = *ppJStack_28;
    for (range_limit._4_4_ = 0; ppJStack_28 = ppJVar14, range_limit._4_4_ < uVar3;
        range_limit._4_4_ = range_limit._4_4_ + 1) {
      uVar13 = (uint)pJVar10[range_limit._4_4_];
      bVar1 = pJVar11[range_limit._4_4_];
      bVar2 = pJVar12[range_limit._4_4_];
      *inptr0 = pJVar5[(int)(uVar13 + *(int *)(p_Var6 + (long)(int)(uint)bVar2 * 4))];
      inptr0[1] = pJVar5[(int)(uVar13 + (int)((ulong)(*(long *)(p_Var9 + (long)(int)(uint)bVar1 * 8)
                                                     + *(long *)(p_Var8 + (long)(int)(uint)bVar2 * 8
                                                                )) >> 0x10))];
      inptr0[2] = pJVar5[(int)(uVar13 + *(int *)(p_Var7 + (long)(int)(uint)bVar1 * 4))];
      inptr0 = inptr0 + 3;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
ycc_rgb_convert (j_decompress_ptr cinfo,
		 JSAMPIMAGE input_buf, JDIMENSION input_row,
		 JSAMPARRAY output_buf, int num_rows)
{
  my_cconvert_ptr cconvert = (my_cconvert_ptr) cinfo->cconvert;
  register int y, cb, cr;
  register JSAMPROW outptr;
  register JSAMPROW inptr0, inptr1, inptr2;
  register JDIMENSION col;
  JDIMENSION num_cols = cinfo->output_width;
  /* copy these pointers into registers if possible */
  register JSAMPLE * range_limit = cinfo->sample_range_limit;
  register int * Crrtab = cconvert->Cr_r_tab;
  register int * Cbbtab = cconvert->Cb_b_tab;
  register INT32 * Crgtab = cconvert->Cr_g_tab;
  register INT32 * Cbgtab = cconvert->Cb_g_tab;
  SHIFT_TEMPS

  while (--num_rows >= 0) {
    inptr0 = input_buf[0][input_row];
    inptr1 = input_buf[1][input_row];
    inptr2 = input_buf[2][input_row];
    input_row++;
    outptr = *output_buf++;
    for (col = 0; col < num_cols; col++) {
      y  = GETJSAMPLE(inptr0[col]);
      cb = GETJSAMPLE(inptr1[col]);
      cr = GETJSAMPLE(inptr2[col]);
      /* Range-limiting is essential due to noise introduced by DCT losses. */
      outptr[RGB_RED] =   range_limit[y + Crrtab[cr]];
      outptr[RGB_GREEN] = range_limit[y +
			      ((int) RIGHT_SHIFT(Cbgtab[cb] + Crgtab[cr],
						 SCALEBITS))];
      outptr[RGB_BLUE] =  range_limit[y + Cbbtab[cb]];
      outptr += RGB_PIXELSIZE;
    }
  }
}